

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layout.cpp
# Opt level: O0

Position solitaire::Layout::getTableauPilePosition(PileId *id)

{
  Position PVar1;
  bool bVar2;
  runtime_error *this;
  uint *puVar3;
  PileId *id_local;
  
  bVar2 = boost::operators_impl::operator>=(id,&interfaces::Solitaire::tableauPilesCount);
  if (!bVar2) {
    puVar3 = piles::PileId::operator_cast_to_unsigned_int_(id);
    PVar1.y = 0x90;
    PVar1.x = *puVar3 * 0x59 + 0x10;
    return PVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  puVar3 = piles::PileId::operator_cast_to_unsigned_int_(id);
  std::runtime_error::runtime_error(this,"Invalid tableau pile id: " + *puVar3);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Position Layout::getTableauPilePosition(const piles::PileId id) {
    if (id >= Solitaire::tableauPilesCount)
        throw std::runtime_error {"Invalid tableau pile id: " + id};

    return Position {
        firstTableauPilePositionX + static_cast<int>(id) * pilesSpacing,
        tableauPilePositionY
    };
}